

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::OpenPopupEx(ImGuiID id)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImGuiPopupRef *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiPopupRef *pIVar7;
  int iVar8;
  ImVec2 *pIVar9;
  ImVec2 IVar10;
  int iVar11;
  int iVar12;
  ImGuiContext *ctx;
  ImVec2 IVar13;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  iVar8 = (GImGui->BeginPopupStack).Size;
  iVar2 = GImGui->FrameCount;
  uVar3 = (pIVar4->IDStack).Data[(long)(pIVar4->IDStack).Size + -1];
  IVar13 = NavCalcPreferredRefPos();
  local_38 = IVar13;
  IVar10 = IVar13;
  if (-256000.0 <= (pIVar6->IO).MousePos.x) {
    pIVar9 = &local_38;
    if (-256000.0 <= (pIVar6->IO).MousePos.y) {
      pIVar9 = &(pIVar6->IO).MousePos;
    }
    IVar10 = *pIVar9;
  }
  iVar11 = (pIVar6->OpenPopupStack).Size;
  if (iVar8 < iVar11) {
    pIVar7 = (pIVar6->OpenPopupStack).Data;
    if ((pIVar7[iVar8].PopupId == id) && (pIVar7[iVar8].OpenFrameCount == iVar2 + -1)) {
      pIVar7[iVar8].OpenFrameCount = iVar2;
    }
    else {
      iVar12 = iVar8 + 1;
      iVar11 = (pIVar6->OpenPopupStack).Capacity;
      if (iVar11 <= iVar8) {
        if (iVar11 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar11 / 2 + iVar11;
        }
        if (iVar11 <= iVar12) {
          iVar11 = iVar12;
        }
        piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
        pIVar7 = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)((long)iVar11 * 0x30,GImAllocatorUserData)
        ;
        pIVar5 = (pIVar6->OpenPopupStack).Data;
        if (pIVar5 != (ImGuiPopupRef *)0x0) {
          memcpy(pIVar7,pIVar5,(long)(pIVar6->OpenPopupStack).Size * 0x30);
          pIVar5 = (pIVar6->OpenPopupStack).Data;
          if ((pIVar5 != (ImGuiPopupRef *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
        }
        (pIVar6->OpenPopupStack).Data = pIVar7;
        (pIVar6->OpenPopupStack).Capacity = iVar11;
      }
      (pIVar6->OpenPopupStack).Size = iVar12;
      pIVar7[iVar8].PopupId = id;
      pIVar7[iVar8].Window = (ImGuiWindow *)0x0;
      pIVar7[iVar8].ParentWindow = pIVar4;
      pIVar7[iVar8].OpenFrameCount = iVar2;
      pIVar7[iVar8].OpenParentId = uVar3;
      pIVar7[iVar8].OpenPopupPos = IVar13;
      pIVar7[iVar8].OpenMousePos = IVar10;
    }
  }
  else {
    if (iVar11 == (pIVar6->OpenPopupStack).Capacity) {
      if (iVar11 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar11 / 2 + iVar11;
      }
      iVar12 = iVar11 + 1;
      if (iVar11 + 1 < iVar8) {
        iVar12 = iVar8;
      }
      piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      pIVar7 = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)((long)iVar12 * 0x30,GImAllocatorUserData);
      pIVar5 = (pIVar6->OpenPopupStack).Data;
      if (pIVar5 != (ImGuiPopupRef *)0x0) {
        memcpy(pIVar7,pIVar5,(long)(pIVar6->OpenPopupStack).Size * 0x30);
        pIVar5 = (pIVar6->OpenPopupStack).Data;
        if ((pIVar5 != (ImGuiPopupRef *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar6->OpenPopupStack).Data = pIVar7;
      (pIVar6->OpenPopupStack).Capacity = iVar12;
      iVar11 = (pIVar6->OpenPopupStack).Size;
    }
    else {
      pIVar7 = (pIVar6->OpenPopupStack).Data;
    }
    pIVar7[iVar11].PopupId = id;
    pIVar7[iVar11].Window = (ImGuiWindow *)0x0;
    pIVar7[iVar11].ParentWindow = pIVar4;
    pIVar7[iVar11].OpenFrameCount = iVar2;
    pIVar7[iVar11].OpenParentId = uVar3;
    pIVar7[iVar11].OpenPopupPos = IVar13;
    pIVar7[iVar11].OpenMousePos = IVar10;
    (pIVar6->OpenPopupStack).Size = (pIVar6->OpenPopupStack).Size + 1;
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupRef popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.ParentWindow = parent_window;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}